

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

int Gia_ObjFanin1CopyRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int *pReprs)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2);
  iVar5 = iVar2 * -0x55555555;
  uVar6 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
  uVar3 = pReprs[(int)(iVar5 - (uVar6 & 0x1fffffff))];
  if (uVar3 == 0xffffffff) {
    uVar4 = pObj[-(ulong)(uVar6 & 0x1fffffff)].Value;
    if ((int)uVar4 < 0) goto LAB_0022ecb5;
    uVar3 = uVar6 >> 0x1d;
  }
  else {
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar4 = uVar3 >> 1;
    if (SBORROW4(uVar4,iVar5) == (int)(uVar4 + iVar2 * 0x55555555) < 0) {
      __assert_fail("Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                    ,0x157,"int Gia_ObjFanin1CopyRepr(Gia_Man_t *, Gia_Obj_t *, int *)");
    }
    if (p->nObjs <= (int)uVar4) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar4 = pGVar1[uVar4].Value;
    if ((int)uVar4 < 0) {
LAB_0022ecb5:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = uVar6 >> 0x1d ^ uVar3;
  }
  return uVar3 & 1 ^ uVar4;
}

Assistant:

int Gia_ObjFanin1CopyRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int * pReprs )
{
    int fanId = Gia_ObjFaninId1p( p, pObj );
    if ( pReprs[fanId] == -1 )
        return Gia_ObjFanin1Copy( pObj );
    assert( Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj) );
    return Abc_LitNotCond( Gia_ObjValue(Gia_ManObj(p, Abc_Lit2Var(pReprs[fanId]))), Gia_ObjFaninC1(pObj) ^ Abc_LitIsCompl(pReprs[fanId]) );
}